

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

bool __thiscall axl::cry::X509Cert::loadDer(X509Cert *this,void *p0,size_t size)

{
  X509 *pXVar1;
  long in_RDX;
  uchar *in_RSI;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *in_RDI;
  X509 *result;
  X509 *cert;
  uchar_t *p;
  x509_st *in_stack_ffffffffffffffb8;
  X509 *local_30;
  uchar *local_28;
  long local_20;
  uchar *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::close(in_RDI,(int)in_RSI);
  local_28 = local_18;
  local_30 = X509_new();
  pXVar1 = d2i_X509(&local_30,&local_28,local_20);
  if (pXVar1 == (X509 *)0x0) {
    local_1 = failWithLastCryptoError();
  }
  else {
    sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::attach
              (in_RDI,in_stack_ffffffffffffffb8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
X509Cert::loadDer(
	const void* p0,
	size_t size
) {
	close();

	const uchar_t* p = (uchar_t*)p0;
	X509* cert = X509_new();
	X509* result = d2i_X509(&cert, &p, size);
	if (!result) {
		ASSERT(cert == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(cert);
	return true;
}